

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::StencilTexturing::FunctionalTest::prepareDestinationTexture
          (FunctionalTest *this,bool is_stencil)

{
  Context *context;
  GLenum internal_format_00;
  uint uVar1;
  GLuint GVar2;
  reference pvVar3;
  GLenum local_44;
  GLenum type;
  GLuint texture_size;
  GLuint texture_id;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  GLuint pixel_size;
  GLenum internal_format;
  GLenum format;
  bool is_stencil_local;
  FunctionalTest *this_local;
  
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&texture_size);
  if (is_stencil) {
    pixel_size = 0x8d94;
    texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0x8232;
    texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    local_44 = 0x1401;
  }
  else {
    pixel_size = 0x1903;
    texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0x822e;
    texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    local_44 = 0x1406;
  }
  uVar1 = (int)texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage << 6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&texture_size,(ulong)uVar1);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&texture_size,0);
  memset(pvVar3,0,(ulong)uVar1);
  internal_format_00 =
       texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  context = (this->super_TestCase).m_context;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&texture_size,0);
  GVar2 = Utils::createAndFill2DTexture(context,8,8,internal_format_00,pixel_size,local_44,pvVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&texture_size);
  return GVar2;
}

Assistant:

GLuint FunctionalTest::prepareDestinationTexture(bool is_stencil)
{
	static const GLuint  n_pixels		 = m_width * m_height;
	GLenum				 format			 = 0;
	GLenum				 internal_format = 0;
	GLuint				 pixel_size		 = 0;
	std::vector<GLubyte> texture_data;
	GLuint				 texture_id   = 0;
	GLuint				 texture_size = 0;
	GLenum				 type		  = 0;

	/* Select size of pixel */
	if (true == is_stencil)
	{
		format			= GL_RED_INTEGER;
		internal_format = GL_R8UI;
		pixel_size		= 1;
		type			= GL_UNSIGNED_BYTE;
	}
	else
	{
		format			= GL_RED;
		internal_format = GL_R32F;
		pixel_size		= 4;
		type			= GL_FLOAT;
	}

	/* Allocate storage */
	texture_size = pixel_size * n_pixels;
	texture_data.resize(texture_size);

	/* Fill texture data */
	memset(&texture_data[0], 0, texture_size);

	/* Create texture */
	texture_id =
		Utils::createAndFill2DTexture(m_context, m_width, m_height, internal_format, format, type, &texture_data[0]);

	/* Done */
	return texture_id;
}